

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

void __thiscall LLVMBC::Module::Module(Module *this,LLVMContext *context_)

{
  this->context = context_;
  (this->functions).
  super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->functions).
  super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->functions).
  super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->globals).
  super__Vector_base<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->globals).
  super__Vector_base<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->globals).
  super__Vector_base<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->value_symtab)._M_h._M_buckets = &(this->value_symtab)._M_h._M_single_bucket;
  (this->value_symtab)._M_h._M_bucket_count = 1;
  (this->value_symtab)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->value_symtab)._M_h._M_element_count = 0;
  (this->value_symtab)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->value_symtab)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->value_symtab)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->named_metadata)._M_h._M_buckets = &(this->named_metadata)._M_h._M_single_bucket;
  (this->named_metadata)._M_h._M_bucket_count = 1;
  (this->named_metadata)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->named_metadata)._M_h._M_element_count = 0;
  (this->named_metadata)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->named_metadata)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->named_metadata)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->unnamed_metadata).
  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unnamed_metadata).
  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unnamed_metadata).
  super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Module::Module(LLVMContext &context_)
    : context(context_)
{
}